

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void __thiscall
dxil_spv::CFGStructurizer::
traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0>
          (CFGStructurizer *this,CFGNode *dominator,CFGNode *from,CFGNode *to,
          anon_class_1_0_00000001 *op)

{
  pointer *this_00;
  bool bVar1;
  size_type __n;
  reference ppCVar2;
  iterator iVar3;
  iterator iVar4;
  reference ppCVar5;
  CFGNode *n_1;
  iterator __end2_1;
  iterator __begin2_1;
  Vector<CFGNode_*> *__range2_1;
  CFGNode *local_a0;
  CFGNode *n;
  iterator __end2;
  iterator __begin2;
  UnorderedSet<CFGNode_*> *__range2;
  Vector<CFGNode_*> linear_visitation_cache;
  UnorderedSet<CFGNode_*> visitation_cache;
  anon_class_1_0_00000001 *op_local;
  CFGNode *to_local;
  CFGNode *from_local;
  CFGNode *dominator_local;
  CFGStructurizer *this_local;
  
  if (from != to) {
    std::
    unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
    ::unordered_set((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)&linear_visitation_cache.
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0>
              (this,dominator,dominator,from,to,op,
               (UnorderedSet<CFGNode_*> *)
               &linear_visitation_cache.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    CFGNode::fixup_merge_info_after_branch_rewrite(dominator,from,to);
    std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
              ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               &__range2);
    __n = std::
          unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ::size((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  *)&linear_visitation_cache.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::reserve
              ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               &__range2,__n);
    this_00 = &linear_visitation_cache.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2 = std::
             unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      *)this_00);
    n = (CFGNode *)
        std::
        unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ::end((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               *)this_00);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.super__Node_iterator_base<dxil_spv::CFGNode_*,_false>,
                              (_Node_iterator_base<dxil_spv::CFGNode_*,_false> *)&n), bVar1) {
      ppCVar2 = std::__detail::_Node_iterator<dxil_spv::CFGNode_*,_true,_false>::operator*(&__end2);
      local_a0 = *ppCVar2;
      if (local_a0->immediate_post_dominator == from) {
        bVar1 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                empty(&local_a0->fake_succ);
        if (bVar1) {
          local_a0->immediate_post_dominator = (CFGNode *)0x0;
          std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          push_back((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)&__range2,&local_a0);
        }
        else {
          local_a0->immediate_post_dominator = to;
        }
      }
      std::__detail::_Node_iterator<dxil_spv::CFGNode_*,_true,_false>::operator++(&__end2);
    }
    iVar3 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   *)&__range2);
    iVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *
                )&__range2);
    std::
    sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>
              (iVar3._M_current,iVar4._M_current);
    __end2_1 = std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      *)&__range2);
    n_1 = (CFGNode *)
          std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
              &__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                               *)&n_1), bVar1) {
      ppCVar5 = __gnu_cxx::
                __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                ::operator*(&__end2_1);
      if ((*ppCVar5)->immediate_post_dominator == (CFGNode *)0x0) {
        CFGNode::recompute_immediate_post_dominator(*ppCVar5);
      }
      __gnu_cxx::
      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
      ::operator++(&__end2_1);
    }
    CFGNode::recompute_immediate_post_dominator(dominator);
    std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::~vector
              ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               &__range2);
    std::
    unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
    ::~unordered_set((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      *)&linear_visitation_cache.
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(CFGNode *dominator, CFGNode *from, CFGNode *to,
                                                                   const Op &op)
{
	if (from == to)
		return;

	UnorderedSet<CFGNode *> visitation_cache;
	traverse_dominated_blocks_and_rewrite_branch(dominator, dominator, from, to, op, visitation_cache);
	dominator->fixup_merge_info_after_branch_rewrite(from, to);

	// Force all post-domination information to be recomputed.
	Vector<CFGNode *> linear_visitation_cache;
	linear_visitation_cache.reserve(visitation_cache.size());

	for (auto *n : visitation_cache)
	{
		if (n->immediate_post_dominator == from)
		{
			if (n->fake_succ.empty())
			{
				n->immediate_post_dominator = nullptr;
				// Ignore any infinite continue blocks.
				// They wreak havoc in post-dominance analysis.
				linear_visitation_cache.push_back(n);
			}
			else
			{
				// Infinite loop blocks must not be traversed again.
				n->immediate_post_dominator = to;
			}
		}
	}

	// Will recompute everything that was cleared out.
	// Compute later nodes first. This way we avoid a potential recursive loop.
	std::sort(linear_visitation_cache.begin(), linear_visitation_cache.end(), [](const CFGNode *a, const CFGNode *b) {
		return a->forward_post_visit_order < b->forward_post_visit_order;
	});

	for (auto *n : linear_visitation_cache)
		if (!n->immediate_post_dominator)
			n->recompute_immediate_post_dominator();
	dominator->recompute_immediate_post_dominator();
}